

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIFont::CGUIFont(CGUIFont *this,IGUIEnvironment *env,path *filename)

{
  _Rb_tree_header *p_Var1;
  IVideoDriver *pIVar2;
  int iVar3;
  undefined4 extraout_var;
  IGUISpriteBank *pIVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_00;
  
  *(undefined8 *)&this->field_0xa8 = 0;
  *(undefined4 *)&this->field_0xb0 = 1;
  *(undefined8 *)this = 0x26e9e8;
  *(undefined8 *)&this->field_0xa0 = 0x26ea68;
  (this->Areas).m_data.
  super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Areas).m_data.
  super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Areas).m_data.
  super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Areas).is_sorted = true;
  p_Var1 = &(this->CharacterMap)._M_t._M_impl.super__Rb_tree_header;
  (this->CharacterMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CharacterMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->CharacterMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->CharacterMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->CharacterMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Driver = (IVideoDriver *)0x0;
  this->SpriteBank = (IGUISpriteBank *)0x0;
  this->Environment = env;
  this->WrongCharacter = 0;
  this->MaxHeight = 0;
  this->GlobalKerningWidth = 0;
  this->GlobalKerningHeight = 0;
  (this->Invisible).str._M_dataplus._M_p = (pointer)&(this->Invisible).str.field_2;
  (this->Invisible).str._M_string_length = 0;
  (this->Invisible).str.field_2._M_local_buf[0] = L'\0';
  if (env != (IGUIEnvironment *)0x0) {
    iVar3 = (*env->_vptr_IGUIEnvironment[6])(env);
    this->Driver = (IVideoDriver *)CONCAT44(extraout_var,iVar3);
    iVar3 = (*this->Environment->_vptr_IGUIEnvironment[0x14])(this->Environment,filename);
    pIVar4 = (IGUISpriteBank *)CONCAT44(extraout_var_00,iVar3);
    this->SpriteBank = pIVar4;
    if (pIVar4 == (IGUISpriteBank *)0x0) {
      iVar3 = (*this->Environment->_vptr_IGUIEnvironment[0x15])(this->Environment,filename);
      pIVar4 = (IGUISpriteBank *)CONCAT44(extraout_var_01,iVar3);
      this->SpriteBank = pIVar4;
      if (pIVar4 == (IGUISpriteBank *)0x0) goto LAB_0021ce3b;
    }
    *(int *)(&pIVar4->field_0x10 + (long)pIVar4->_vptr_IGUISpriteBank[-3]) =
         *(int *)(&pIVar4->field_0x10 + (long)pIVar4->_vptr_IGUISpriteBank[-3]) + 1;
  }
LAB_0021ce3b:
  pIVar2 = this->Driver;
  if (pIVar2 != (IVideoDriver *)0x0) {
    *(int *)(&pIVar2->field_0x10 + (long)pIVar2->_vptr_IVideoDriver[-3]) =
         *(int *)(&pIVar2->field_0x10 + (long)pIVar2->_vptr_IVideoDriver[-3]) + 1;
  }
  (**(code **)(*(long *)this + 0x40))(this,L" ");
  return;
}

Assistant:

CGUIFont::CGUIFont(IGUIEnvironment *env, const io::path &filename) :
		Driver(0), SpriteBank(0), Environment(env), WrongCharacter(0),
		MaxHeight(0), GlobalKerningWidth(0), GlobalKerningHeight(0)
{
#ifdef _DEBUG
	setDebugName("CGUIFont");
#endif

	if (Environment) {
		// don't grab environment, to avoid circular references
		Driver = Environment->getVideoDriver();

		SpriteBank = Environment->getSpriteBank(filename);
		if (!SpriteBank) // could be default-font which has no file
			SpriteBank = Environment->addEmptySpriteBank(filename);
		if (SpriteBank)
			SpriteBank->grab();
	}

	if (Driver)
		Driver->grab();

	setInvisibleCharacters(L" ");
}